

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_NormalIterators_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_NormalIterators_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pointer psVar2;
  undefined8 *puVar3;
  pointer psVar4;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  AssertHelper local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  undefined8 *local_d0;
  undefined1 local_c8 [32];
  const_nonempty_iterator local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  const_iterator local_90;
  const_nonempty_iterator local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [64];
  
  pHVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::begin((const_iterator *)local_80,&this_00->rep);
  local_c8._8_8_ =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table + 0x10))->_M_start;
  local_c8._16_8_ =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x18);
  local_a8 = (const_nonempty_iterator)0x0;
  local_88 = (const_nonempty_iterator)0x0;
  local_c8._0_8_ = this_00;
  local_c8._24_8_ = local_c8._16_8_;
  local_a0._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._8_8_;
  local_98._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._16_8_;
  local_90._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._16_8_;
  local_70._56_8_ = pHVar1;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_c8);
  local_d8[0] = (internal)0x0;
  if (local_80._8_8_ == local_c8._8_8_) {
    if ((local_70._0_8_ == local_c8._16_8_) && (local_70._8_8_ == local_c8._24_8_)) {
      if (local_70._8_8_ == local_70._0_8_) {
        local_d8[0] = (internal)0x1;
      }
      else {
        local_d8[0] = (internal)((const_nonempty_iterator)local_70._16_8_ == local_a8);
      }
    }
    else {
      local_d8[0] = (internal)0x0;
    }
  }
  local_d0 = (undefined8 *)0x0;
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,local_d8,(AssertionResult *)"this->ht_.begin() == this->ht_.end()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0xe2,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_80._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_70) {
      operator_delete((void *)local_80._0_8_);
    }
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_c8._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  puVar3 = local_d0;
  if (local_d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_d0 != local_d0 + 2) {
      operator_delete((undefined8 *)*local_d0);
    }
    operator_delete(puVar3);
  }
  local_c8._0_8_ = UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_80,this_00,(value_type *)local_c8);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::begin((const_iterator *)local_80,&this_00->rep);
  local_c8._8_8_ =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table + 0x10))->_M_start;
  local_c8._16_8_ =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x18);
  local_a8 = (const_nonempty_iterator)0x0;
  local_88 = (const_nonempty_iterator)0x0;
  local_c8._0_8_ = this_00;
  local_c8._24_8_ = local_c8._16_8_;
  local_a0._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._8_8_;
  local_98._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._16_8_;
  local_90._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._16_8_;
  local_70._56_8_ = pHVar1;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_c8);
  local_d8[0] = (internal)0x1;
  if (((local_80._8_8_ == local_c8._8_8_) && (local_70._0_8_ == local_c8._16_8_)) &&
     (local_70._8_8_ == local_c8._24_8_)) {
    if (local_70._8_8_ == local_70._0_8_) {
      local_d8[0] = (internal)0x0;
    }
    else {
      local_d8[0] = (internal)((const_nonempty_iterator)local_70._16_8_ != local_a8);
    }
  }
  local_d0 = (undefined8 *)0x0;
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,(AssertionResult *)"it != this->ht_.end()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0xe6,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  puVar3 = local_d0;
  if (local_d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_d0 != local_d0 + 2) {
      operator_delete((undefined8 *)*local_d0);
    }
    operator_delete(puVar3);
  }
  local_70._16_8_ = local_70._16_8_ + 8;
  psVar4 = (pointer)local_70._8_8_;
  if ((pointer)local_70._16_8_ ==
      (pointer)((ulong)*(uint16_t *)(local_70._8_8_ + 0x18) * 8 + *(long *)local_70._8_8_)) {
    do {
      psVar4 = (pointer)(local_70._8_8_ + 0x28);
      if (psVar4 == (pointer)local_70._0_8_) break;
      local_70._16_8_ = psVar4->group;
      psVar2 = (pointer)(local_70._8_8_ + 0x28);
      local_70._8_8_ = psVar4;
    } while ((psVar2->settings).num_buckets == 0);
  }
  local_70._8_8_ = psVar4;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_80);
  local_c8._8_8_ =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table + 0x10))->_M_start;
  local_c8._16_8_ =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x18);
  local_a8 = (pointer)0x0;
  local_88 = (const_nonempty_iterator)0x0;
  local_c8._0_8_ = this_00;
  local_c8._24_8_ = local_c8._16_8_;
  local_a0._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._8_8_;
  local_98._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._16_8_;
  local_90._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8._16_8_;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_c8);
  local_d8[0] = (internal)0x0;
  if (local_80._8_8_ == local_c8._8_8_) {
    if ((local_70._0_8_ == local_c8._16_8_) && (local_70._8_8_ == local_c8._24_8_)) {
      if (local_70._8_8_ == local_70._0_8_) {
        local_d8[0] = (internal)0x1;
      }
      else {
        local_d8[0] = (internal)((const_nonempty_iterator)local_70._16_8_ == local_a8);
      }
    }
    else {
      local_d8[0] = (internal)0x0;
    }
  }
  local_d0 = (undefined8 *)0x0;
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,(AssertionResult *)"it == this->ht_.end()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0xe8,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c8 + 0x10)
       ) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  puVar3 = local_d0;
  if (local_d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_d0 != local_d0 + 2) {
      operator_delete((undefined8 *)*local_d0);
    }
    operator_delete(puVar3);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, NormalIterators) {
  EXPECT_TRUE(this->ht_.begin() == this->ht_.end());
  this->ht_.insert(this->UniqueObject(1));
  {
    typename TypeParam::iterator it = this->ht_.begin();
    EXPECT_TRUE(it != this->ht_.end());
    ++it;
    EXPECT_TRUE(it == this->ht_.end());
  }
}